

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prov_custom_hsm.c
# Opt level: O1

char * prov_custom_hsm_get_common_name(HSM_CLIENT_HANDLE handle)

{
  size_t sVar1;
  char *__dest;
  char *pcVar2;
  
  if (handle == (HSM_CLIENT_HANDLE)0x0) {
    pcVar2 = "Invalid handle value specified\r";
  }
  else {
    pcVar2 = *(char **)((long)handle + 8);
    sVar1 = strlen(pcVar2);
    __dest = (char *)malloc(sVar1 + 1);
    if (__dest != (char *)0x0) {
      pcVar2 = strcpy(__dest,pcVar2);
      return pcVar2;
    }
    pcVar2 = "Failure allocating certificate\r";
  }
  puts(pcVar2);
  return (char *)0x0;
}

Assistant:

char* prov_custom_hsm_get_common_name(HSM_CLIENT_HANDLE handle)
{
    char* result;
    if (handle == NULL)
    {
        (void)printf("Invalid handle value specified\r\n");
        result = NULL;
    }
    else
    {
        // TODO: Malloc the common name for the iothub sdk to free
        // this value will be sent to dps
        CUSTOM_HSM_SAMPLE_INFO* hsm_info = (CUSTOM_HSM_SAMPLE_INFO*)handle;
        size_t len = strlen(hsm_info->common_name);
        if ((result = (char*)malloc(len + 1)) == NULL)
        {
            (void)printf("Failure allocating certificate\r\n");
            result = NULL;
        }
        else
        {
            strcpy(result, hsm_info->common_name);
        }
    }
    return result;
}